

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

void __thiscall QPlainTextEdit::dragMoveEvent(QPlainTextEdit *this,QDragMoveEvent *e)

{
  QPlainTextEditPrivate *this_00;
  QPlainTextEditControl *this_01;
  QScrollBar *this_02;
  uint uVar1;
  LayoutDirection LVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  qreal qVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  auVar8._0_8_ = (double)((ulong)*(double *)(e + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
                 *(double *)(e + 0x10);
  auVar8._8_8_ = (double)((ulong)*(double *)(e + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
                 *(double *)(e + 0x18);
  auVar8 = minpd(_DAT_0066f5d0,auVar8);
  auVar9._8_8_ = -(ulong)(-2147483648.0 < auVar8._8_8_);
  auVar9._0_8_ = -(ulong)(-2147483648.0 < auVar8._0_8_);
  uVar1 = movmskpd((int)local_28,auVar9);
  uVar6 = 0x8000000000000000;
  if ((uVar1 & 2) != 0) {
    uVar6 = (ulong)(uint)(int)auVar8._8_8_ << 0x20;
  }
  uVar5 = 0x80000000;
  if ((uVar1 & 1) != 0) {
    uVar5 = (ulong)(uint)(int)auVar8._0_8_;
  }
  this_00->autoScrollDragPos = (QPoint)(uVar5 | uVar6);
  if ((this_00->autoScrollTimer).m_id == Invalid) {
    QBasicTimer::start(&this_00->autoScrollTimer,100000000,1,this);
  }
  this_01 = this_00->control;
  LVar2 = QWidget::layoutDirection
                    (*(QWidget **)
                      &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                       super_QWidgetPrivate.field_0x8);
  this_02 = (this_00->super_QAbstractScrollAreaPrivate).hbar;
  if (LVar2 == RightToLeft) {
    iVar3 = QAbstractSlider::maximum(&this_02->super_QAbstractSlider);
    iVar4 = QAbstractSlider::value
                      (&((this_00->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
    iVar3 = iVar3 - iVar4;
  }
  else {
    iVar3 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
  }
  qVar7 = QPlainTextEditPrivate::verticalOffset(this_00,this_00->control->topBlock,this_00->topLine)
  ;
  local_38.yp = qVar7 + this_00->topLineFracture;
  local_38.xp = (double)iVar3;
  QWidgetTextControl::processEvent
            ((QWidgetTextControl *)this_01,(QEvent *)e,&local_38,
             (this_00->super_QAbstractScrollAreaPrivate).viewport);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEdit::dragMoveEvent(QDragMoveEvent *e)
{
    Q_D(QPlainTextEdit);
    d->autoScrollDragPos = e->position().toPoint();
    if (!d->autoScrollTimer.isActive())
        d->autoScrollTimer.start(100, this);
    d->sendControlEvent(e);
}